

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

void __thiscall ev3dev::led::flash(led *this,uint on_ms,uint off_ms)

{
  int iVar1;
  duration<long,_std::ratio<1L,_1000L>_> local_d0;
  string local_c8;
  led local_a8;
  led local_80;
  string local_58 [40];
  
  if (flash(unsigned_int,unsigned_int)::timer_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&flash(unsigned_int,unsigned_int)::timer_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&flash(unsigned_int,unsigned_int)::timer_abi_cxx11_,"timer",
                 (allocator *)&local_d0);
      __cxa_atexit(std::__cxx11::string::~string,&flash(unsigned_int,unsigned_int)::timer_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&flash(unsigned_int,unsigned_int)::timer_abi_cxx11_);
    }
  }
  std::__cxx11::string::string
            ((string *)&local_c8,(string *)&flash(unsigned_int,unsigned_int)::timer_abi_cxx11_);
  set_trigger(&local_80,this,&local_c8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c8);
  if (on_ms != 0) {
    local_d0.__r = 100;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_d0);
    set_delay_on((led *)local_58,this,on_ms);
    std::__cxx11::string::~string(local_58);
    set_delay_off(&local_a8,this,off_ms);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return;
}

Assistant:

void led::flash(unsigned on_ms, unsigned off_ms) {
    static const mode_type timer("timer");
    set_trigger(timer);
    if (on_ms) {
        // A workaround for ev3dev/ev3dev#225.
        // It takes some time for delay_{on,off} sysfs attributes to appear after
        // led trigger has been set to "timer".
        for (int i = 0; ; ++i) {
            std::this_thread::sleep_for(std::chrono::milliseconds(100));
            try {
                set_delay_on (on_ms );
                set_delay_off(off_ms);
                break;
            } catch(...) {
                if (i >= 5) throw;
            }
        }
    }
}